

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPUtils.cpp
# Opt level: O0

string * __thiscall
net_uv::kcp_making_syn_and_ack_abi_cxx11_
          (string *__return_storage_ptr__,net_uv *this,uint32_t value,uint32_t conv)

{
  int iVar1;
  string *psVar2;
  allocator local_a1;
  ulong local_a0;
  size_t n;
  char str_send_back_conv [128];
  uint32_t conv_local;
  uint32_t value_local;
  
  str_send_back_conv._124_4_ = SUB84(this,0);
  str_send_back_conv[0x68] = '\0';
  str_send_back_conv[0x69] = '\0';
  str_send_back_conv[0x6a] = '\0';
  str_send_back_conv[0x6b] = '\0';
  str_send_back_conv[0x6c] = '\0';
  str_send_back_conv[0x6d] = '\0';
  str_send_back_conv[0x6e] = '\0';
  str_send_back_conv[0x6f] = '\0';
  str_send_back_conv[0x70] = '\0';
  str_send_back_conv[0x71] = '\0';
  str_send_back_conv[0x72] = '\0';
  str_send_back_conv[0x73] = '\0';
  str_send_back_conv[0x74] = '\0';
  str_send_back_conv[0x75] = '\0';
  str_send_back_conv[0x76] = '\0';
  str_send_back_conv[0x77] = '\0';
  str_send_back_conv[0x58] = '\0';
  str_send_back_conv[0x59] = '\0';
  str_send_back_conv[0x5a] = '\0';
  str_send_back_conv[0x5b] = '\0';
  str_send_back_conv[0x5c] = '\0';
  str_send_back_conv[0x5d] = '\0';
  str_send_back_conv[0x5e] = '\0';
  str_send_back_conv[0x5f] = '\0';
  str_send_back_conv[0x60] = '\0';
  str_send_back_conv[0x61] = '\0';
  str_send_back_conv[0x62] = '\0';
  str_send_back_conv[99] = '\0';
  str_send_back_conv[100] = '\0';
  str_send_back_conv[0x65] = '\0';
  str_send_back_conv[0x66] = '\0';
  str_send_back_conv[0x67] = '\0';
  str_send_back_conv[0x48] = '\0';
  str_send_back_conv[0x49] = '\0';
  str_send_back_conv[0x4a] = '\0';
  str_send_back_conv[0x4b] = '\0';
  str_send_back_conv[0x4c] = '\0';
  str_send_back_conv[0x4d] = '\0';
  str_send_back_conv[0x4e] = '\0';
  str_send_back_conv[0x4f] = '\0';
  str_send_back_conv[0x50] = '\0';
  str_send_back_conv[0x51] = '\0';
  str_send_back_conv[0x52] = '\0';
  str_send_back_conv[0x53] = '\0';
  str_send_back_conv[0x54] = '\0';
  str_send_back_conv[0x55] = '\0';
  str_send_back_conv[0x56] = '\0';
  str_send_back_conv[0x57] = '\0';
  str_send_back_conv[0x38] = '\0';
  str_send_back_conv[0x39] = '\0';
  str_send_back_conv[0x3a] = '\0';
  str_send_back_conv[0x3b] = '\0';
  str_send_back_conv[0x3c] = '\0';
  str_send_back_conv[0x3d] = '\0';
  str_send_back_conv[0x3e] = '\0';
  str_send_back_conv[0x3f] = '\0';
  str_send_back_conv[0x40] = '\0';
  str_send_back_conv[0x41] = '\0';
  str_send_back_conv[0x42] = '\0';
  str_send_back_conv[0x43] = '\0';
  str_send_back_conv[0x44] = '\0';
  str_send_back_conv[0x45] = '\0';
  str_send_back_conv[0x46] = '\0';
  str_send_back_conv[0x47] = '\0';
  str_send_back_conv[0x28] = '\0';
  str_send_back_conv[0x29] = '\0';
  str_send_back_conv[0x2a] = '\0';
  str_send_back_conv[0x2b] = '\0';
  str_send_back_conv[0x2c] = '\0';
  str_send_back_conv[0x2d] = '\0';
  str_send_back_conv[0x2e] = '\0';
  str_send_back_conv[0x2f] = '\0';
  str_send_back_conv[0x30] = '\0';
  str_send_back_conv[0x31] = '\0';
  str_send_back_conv[0x32] = '\0';
  str_send_back_conv[0x33] = '\0';
  str_send_back_conv[0x34] = '\0';
  str_send_back_conv[0x35] = '\0';
  str_send_back_conv[0x36] = '\0';
  str_send_back_conv[0x37] = '\0';
  str_send_back_conv[0x18] = '\0';
  str_send_back_conv[0x19] = '\0';
  str_send_back_conv[0x1a] = '\0';
  str_send_back_conv[0x1b] = '\0';
  str_send_back_conv[0x1c] = '\0';
  str_send_back_conv[0x1d] = '\0';
  str_send_back_conv[0x1e] = '\0';
  str_send_back_conv[0x1f] = '\0';
  str_send_back_conv[0x20] = '\0';
  str_send_back_conv[0x21] = '\0';
  str_send_back_conv[0x22] = '\0';
  str_send_back_conv[0x23] = '\0';
  str_send_back_conv[0x24] = '\0';
  str_send_back_conv[0x25] = '\0';
  str_send_back_conv[0x26] = '\0';
  str_send_back_conv[0x27] = '\0';
  str_send_back_conv[8] = '\0';
  str_send_back_conv[9] = '\0';
  str_send_back_conv[10] = '\0';
  str_send_back_conv[0xb] = '\0';
  str_send_back_conv[0xc] = '\0';
  str_send_back_conv[0xd] = '\0';
  str_send_back_conv[0xe] = '\0';
  str_send_back_conv[0xf] = '\0';
  str_send_back_conv[0x10] = '\0';
  str_send_back_conv[0x11] = '\0';
  str_send_back_conv[0x12] = '\0';
  str_send_back_conv[0x13] = '\0';
  str_send_back_conv[0x14] = '\0';
  str_send_back_conv[0x15] = '\0';
  str_send_back_conv[0x16] = '\0';
  str_send_back_conv[0x17] = '\0';
  n = 0;
  str_send_back_conv[0] = '\0';
  str_send_back_conv[1] = '\0';
  str_send_back_conv[2] = '\0';
  str_send_back_conv[3] = '\0';
  str_send_back_conv[4] = '\0';
  str_send_back_conv[5] = '\0';
  str_send_back_conv[6] = '\0';
  str_send_back_conv[7] = '\0';
  psVar2 = __return_storage_ptr__;
  str_send_back_conv._120_4_ = value;
  iVar1 = snprintf((char *)&n,0x80,"%s value:%u conv:%u%s","kcp_syn&ack_packet:",
                   (ulong)this & 0xffffffff,(ulong)value,"$%^^&",__return_storage_ptr__,0,0);
  local_a0 = (long)iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&n,(long)iVar1,&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return psVar2;
}

Assistant:

std::string kcp_making_syn_and_ack(uint32_t value, uint32_t conv)
{
	char str_send_back_conv[128] = "";
	size_t n = snprintf(str_send_back_conv, sizeof(str_send_back_conv), "%s value:%u conv:%u%s", NET_KCP_SYN_AND_ACK_PACKET, value, conv, NET_KCP_PACKET_END_FLAG);
	return std::string(str_send_back_conv, n);
}